

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::DoParse
          (Parser *this,char *source,char **include_paths,char *source_filename,
          char *include_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
  *this_00;
  _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
  *this_01;
  uint64_t uVar7;
  mapped_type *pmVar8;
  long *plVar9;
  char *pcVar10;
  string *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar13;
  string *psVar14;
  EnumDef **dest;
  int t;
  char **ppcVar15;
  _Alloc_hider _Var16;
  char *in_R9;
  _Rb_tree_header *p_Var17;
  string contents;
  string name;
  string filepath;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider _Stack_108;
  size_t local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  key_type local_e0;
  string local_c0;
  string local_a0;
  allocator<char> local_79;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_78;
  string *local_70;
  char *local_68;
  key_type local_60;
  char **local_58;
  char *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
  *local_40;
  _Rb_tree_header *local_38;
  
  local_60 = 0;
  local_68 = include_filename;
  local_58 = include_paths;
  if (include_filename != (char *)0x0) {
    local_50 = in_R9;
    bVar3 = FileExists(include_filename);
    ppcVar15 = (char **)0x0;
    if (bVar3) {
      ppcVar15 = include_paths;
    }
    local_60 = anon_unknown_0::HashFile(include_filename,(char *)ppcVar15);
    pcVar10 = *(char **)(source + 0x350);
    if (pcVar10 != (char *)0x0) {
      pcVar13 = source + 0x348;
      do {
        if (*(ulong *)(pcVar10 + 0x20) >= local_60) {
          pcVar13 = pcVar10;
        }
        pcVar10 = *(char **)(pcVar10 + (ulong)(*(ulong *)(pcVar10 + 0x20) < local_60) * 8 + 0x10);
      } while (pcVar10 != (char *)0x0);
      if ((pcVar13 != source + 0x348) && (*(ulong *)(pcVar13 + 0x20) <= local_60))
      goto LAB_00121091;
    }
    pcVar10 = "";
    if (local_50 != (char *)0x0) {
      pcVar10 = local_50;
    }
    local_70 = (string *)source_filename;
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(source + 0x340),&local_60);
    pcVar13 = (char *)pmVar5->_M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar13,(ulong)pcVar10);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_128 + 8);
    local_118._M_allocated_capacity = 0;
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_128._8_8_ = 0;
    local_100 = 0;
    local_118._8_8_ = paVar12;
    _Stack_108._M_p = (pointer)paVar12;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    sVar6 = strlen(include_filename);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,include_filename,include_filename + sVar6);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                             *)(source + 0x370),&local_e0)->_M_t;
    std::
    _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::clear(this_00);
    if ((_Base_ptr)local_118._M_allocated_capacity != (_Base_ptr)0x0) {
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_color = local_128._8_4_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_118._M_allocated_capacity;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_118._8_8_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)_Stack_108._M_p;
      *(_Rb_tree_header **)(local_118._M_allocated_capacity + 8) =
           &(this_00->_M_impl).super__Rb_tree_header;
      (this_00->_M_impl).super__Rb_tree_header._M_node_count = local_100;
      local_118._M_allocated_capacity = 0;
      local_100 = 0;
      local_118._8_8_ = paVar12;
      _Stack_108._M_p = (pointer)paVar12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1))
      ;
    }
    std::
    _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::~_Rb_tree((_Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
                 *)local_128);
    source_filename = (char *)local_70;
  }
  ppcVar15 = local_58;
  pcVar10 = local_68;
  local_78 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)DoParse::current_directory;
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       *)source_filename !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       *)0x0) {
    local_78 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)source_filename;
  }
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::_M_erase_at_end((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                     *)(source + 0x730),*(pointer *)(source + 0x730));
  FlatBufferBuilderImpl<false>::Clear((FlatBufferBuilderImpl<false> *)(source + 0x1c8));
  *(undefined8 *)(source + 0x198) = *(undefined8 *)(source + 0x1a0);
  StartParseFile(this,source,(char *)ppcVar15);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(source + 0x28);
    local_40 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                *)(source + 0x370);
    local_70 = (string *)(source + 0x348);
    local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(source + 0x3a0)
    ;
    local_38 = &(local_78->_M_t)._M_impl.super__Rb_tree_header;
    do {
      while ((source[0x3f9] == '\x01' &&
             (((iVar4 = std::__cxx11::string::compare((char *)__args), iVar4 == 0 ||
               (iVar4 = std::__cxx11::string::compare((char *)__args), iVar4 == 0)) ||
              (iVar4 = std::__cxx11::string::compare((char *)__args), iVar4 == 0))))) {
        ParseProtoDecl(this);
LAB_001209eb:
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121096;
      }
      iVar4 = *(int *)(source + 0x1c);
      t = (int)source;
      if (iVar4 != 0x104) goto LAB_00120b91;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>(local_48,__args);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            Expect(this,t);
            goto LAB_001209eb;
          }
        }
        break;
      }
      iVar4 = *(int *)(source + 0x1c);
      if (iVar4 != 0x104) {
LAB_00120b91:
        if (iVar4 == 0x100) goto LAB_00120b9c;
        local_78 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    *)(source + 0x3b8);
        local_70 = (string *)(source + 800);
        goto LAB_00120c55;
      }
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 != 0) {
        iVar4 = *(int *)(source + 0x1c);
        if ((source[0x3f9] == '\x01') && (iVar4 == 0x104)) {
          iVar4 = std::__cxx11::string::compare((char *)__args);
          if (iVar4 == 0) goto LAB_0012054b;
          iVar4 = *(int *)(source + 0x1c);
        }
        goto LAB_00120b91;
      }
LAB_0012054b:
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
      pcVar13 = extraout_RDX;
      if ((source[0x3f9] == '\x01') &&
         (iVar4 = std::__cxx11::string::compare((char *)__args), pcVar13 = extraout_RDX_00,
         iVar4 == 0)) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        pcVar13 = extraout_RDX_01;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
      }
      PosixPath_abi_cxx11_(&local_e0,*(flatbuffers **)(source + 0x28),pcVar13);
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_00120b68:
        _Var16._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00120b80;
        break;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      if (pcVar10 != (char *)0x0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        sVar6 = strlen(pcVar10);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar10,pcVar10 + sVar6)
        ;
        StripFileName((string *)local_128,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        ConCatPathFileName(&local_c0,(string *)local_128,&local_e0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if ((local_a0._M_string_length == 0) ||
           (bVar3 = FileExists(local_a0._M_dataplus._M_p), !bVar3)) goto LAB_001206dd;
        if (local_a0._M_string_length != 0) goto LAB_001207a2;
LAB_00120b01:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,"unable to locate include file: ",&local_e0);
        Error(this,(string *)source);
LAB_00120b27:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00120b68;
      }
LAB_001206dd:
      pcVar10 = *(char **)&(local_78->_M_t)._M_impl;
      p_Var17 = local_38;
      while (pcVar10 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar10,&local_79);
        ConCatPathFileName((string *)local_128,&local_c0,&local_e0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = FileExists(local_a0._M_dataplus._M_p);
        if (bVar3) break;
        p_Var2 = &p_Var17->_M_header;
        p_Var17 = (_Rb_tree_header *)&(p_Var17->_M_header)._M_parent;
        pcVar10 = *(char **)p_Var2;
      }
      if (local_a0._M_string_length == 0) goto LAB_00120b01;
      pcVar10 = local_68;
      if (local_68 != (char *)0x0) {
LAB_001207a2:
        local_128._0_8_ = &local_118;
        local_128._8_8_ = 0;
        local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
        _Stack_108._M_p = (pointer)&local_f8;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)&_Stack_108);
        std::__cxx11::string::_M_assign((string *)local_128);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        sVar6 = strlen(pcVar10);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar10,pcVar10 + sVar6)
        ;
        this_01 = (_Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                     ::operator[](local_40,&local_c0);
        std::
        _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
        ::_M_insert_unique<flatbuffers::IncludedFile_const&>(this_01,(IncludedFile *)local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_108._M_p != &local_f8) {
          operator_delete(_Stack_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
      }
      local_128._0_8_ = &local_118;
      local_128._8_8_ = 0;
      local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = LoadFile(local_a0._M_dataplus._M_p,true,(string *)local_128);
      uVar7 = anon_unknown_0::HashFile(local_a0._M_dataplus._M_p,(char *)local_128._0_8_);
      psVar11 = *(string **)(source + 0x350);
      psVar14 = local_70;
      if (psVar11 == (string *)0x0) {
LAB_001209fd:
        if (bVar3) {
          DoParse(this,source,(char **)local_128._0_8_,(char *)local_78,local_a0._M_dataplus._M_p);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            if (source[0x3fb] == '\0') {
              MarkGenerated((Parser *)source);
            }
            source[0x2f8] = '\0';
            source[0x2f9] = '\0';
            source[0x2fa] = '\0';
            source[0x2fb] = '\0';
            source[0x2fc] = '\0';
            source[0x2fd] = '\0';
            source[0x2fe] = '\0';
            source[0x2ff] = '\0';
            source[0x308] = '\0';
            source[0x309] = '\0';
            source[0x30a] = '\0';
            source[0x30b] = '\0';
            source[0x30c] = '\0';
            source[0x30d] = '\0';
            source[0x30e] = '\0';
            source[0x30f] = '\0';
            **(undefined1 **)(source + 0x300) = 0;
            source[0x328] = '\0';
            source[0x329] = '\0';
            source[0x32a] = '\0';
            source[0x32b] = '\0';
            source[0x32c] = '\0';
            source[0x32d] = '\0';
            source[0x32e] = '\0';
            source[0x32f] = '\0';
            **(undefined1 **)(source + 800) = 0;
            std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(source + 0x340),&local_60);
            DoParse(this,source,local_58,(char *)local_78,local_68);
          }
        }
        else {
          std::operator+(&local_c0,"unable to load include file: ",&local_e0);
          Error(this,(string *)source);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00120b27;
      }
      do {
        if (*(ulong *)(psVar11 + 0x20) >= uVar7) {
          psVar14 = psVar11;
        }
        psVar11 = *(string **)(psVar11 + (ulong)(*(ulong *)(psVar11 + 0x20) < uVar7) * 8 + 0x10);
      } while (psVar11 != (string *)0x0);
      if ((psVar14 == local_70) || (uVar7 < *(ulong *)(psVar14 + 0x20))) goto LAB_001209fd;
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar1 = *(char *)&(this->super_ParserState).prev_cursor_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      pcVar10 = local_68;
    } while (cVar1 == '\0');
  }
  goto LAB_00121096;
LAB_00120c55:
  do {
    if (source[0x3f9] == '\x01') {
      ParseProtoDecl(this);
LAB_00120dfa:
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar1 = *(char *)&(this->super_ParserState).prev_cursor_;
joined_r0x00120f00:
      if (cVar1 != '\0') goto LAB_00121096;
    }
    else {
      if (iVar4 == 0x104) {
        iVar4 = std::__cxx11::string::compare((char *)__args);
        if (iVar4 == 0) {
          ParseNamespace(this);
          goto LAB_00120dfa;
        }
        iVar4 = *(int *)(source + 0x1c);
      }
      if (iVar4 != 0x104) {
        if (iVar4 != 0x7b) goto LAB_00120dbe;
        goto LAB_00121091;
      }
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        dest = (EnumDef **)0x0;
LAB_00120df0:
        ParseEnum(this,SUB81(source,0),dest,(char *)0x0);
        goto LAB_00120dfa;
      }
      if (*(int *)(source + 0x1c) != 0x104) goto LAB_00120dbe;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        dest = (EnumDef **)0x1;
        goto LAB_00120df0;
      }
      if (*(int *)(source + 0x1c) != 0x104) goto LAB_00120dbe;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          local_128._0_8_ = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_128,*(long *)(source + 0x28),
                     *(long *)(source + 0x30) + *(long *)(source + 0x28));
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            ParseNamespacing(this,(string *)source,(string *)local_128);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              if (*(long *)(source + 0x558) != 0) {
LAB_00120ec2:
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                cVar1 = *(char *)&(this->super_ParserState).prev_cursor_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._0_8_ != &local_118) {
                  operator_delete((void *)local_128._0_8_,
                                  (ulong)(local_118._M_allocated_capacity + 1));
                }
                goto joined_r0x00120f00;
              }
              bVar3 = SetRootType((Parser *)source,(char *)local_128._0_8_);
              if (bVar3) {
                if (*(char *)(*(long *)(source + 0x2f8) + 0x110) != '\x01') goto LAB_00120ec2;
                local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e0,"root type must be a table","");
                Error(this,(string *)source);
              }
              else {
                std::operator+(&local_e0,"unknown root type: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_128);
                Error(this,(string *)source);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,
                                (ulong)(local_e0.field_2._M_allocated_capacity + 1));
              }
            }
          }
          goto LAB_00120c05;
        }
        goto LAB_00121096;
      }
      if (*(int *)(source + 0x1c) != 0x104) goto LAB_00120dbe;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121096;
        std::__cxx11::string::_M_assign((string *)(source + 0x300));
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121096;
        if (*(long *)(source + 0x308) == 4) {
LAB_00120fa3:
          Expect(this,t);
          goto LAB_00120dfa;
        }
        NumToString<unsigned_long>(&local_a0,4);
        std::operator+(&local_e0,"file_identifier must be exactly ",&local_a0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_128._0_8_ = &local_118;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar12) {
          local_118._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_118._8_8_ = plVar9[3];
        }
        else {
          local_118._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_128._8_8_ = plVar9[1];
        *plVar9 = (long)paVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        Error(this,(string *)source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00121096;
        local_e0.field_2._M_allocated_capacity =
             CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0])
        ;
        _Var16._M_p = local_a0._M_dataplus._M_p;
        goto LAB_00120b80;
      }
      if (*(int *)(source + 0x1c) != 0x104) goto LAB_00120dbe;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          std::__cxx11::string::_M_assign(local_70);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_00120fa3;
        }
        goto LAB_00121096;
      }
      if (*(int *)(source + 0x1c) != 0x104) goto LAB_00120dbe;
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 == 0) {
        local_128._0_8_ = &local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"includes must come before declarations","");
        Error(this,(string *)source);
        goto LAB_00120c05;
      }
      if (*(int *)(source + 0x1c) != 0x104) {
LAB_00120dbe:
        ParseDecl(this,source);
        goto LAB_00120dfa;
      }
      iVar4 = std::__cxx11::string::compare((char *)__args);
      if (iVar4 != 0) {
        if ((*(int *)(source + 0x1c) == 0x104) &&
           (iVar4 = std::__cxx11::string::compare((char *)__args), iVar4 == 0)) {
          ParseService(this,source);
          goto LAB_00120dfa;
        }
        goto LAB_00120dbe;
      }
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121096;
      local_128._0_8_ = &local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,*(long *)(source + 0x28),
                 *(long *)(source + 0x30) + *(long *)(source + 0x28));
      if (*(int *)(source + 0x1c) == 0x104) {
        Next(this);
      }
      else {
        Expect(this,t);
      }
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120c05;
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120c05;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](local_78,(key_type *)local_128);
      *pmVar8 = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
      }
    }
    iVar4 = *(int *)(source + 0x1c);
  } while (iVar4 != 0x100);
LAB_00120b9c:
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121096;
  if ((source[0x619] == '\x01') && (source[0x6f9] == '\x01')) {
    local_128._0_8_ = &local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"treating warnings as errors, failed due to above warnings","");
    Error(this,(string *)source);
LAB_00120c05:
    local_e0.field_2._M_allocated_capacity = local_118._M_allocated_capacity;
    _Var16._M_p = (pointer)local_128._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ != &local_118) {
LAB_00120b80:
      operator_delete(_Var16._M_p,
                      (ulong)((long)&((_Base_ptr)local_e0.field_2._M_allocated_capacity)->_M_color +
                             1));
    }
    goto LAB_00121096;
  }
LAB_00121091:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00121096:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParse(const char *source, const char **include_paths,
                             const char *source_filename,
                             const char *include_filename) {
  uint64_t source_hash = 0;
  if (source_filename) {
    // If the file is in-memory, don't include its contents in the hash as we
    // won't be able to load them later.
    if (FileExists(source_filename))
      source_hash = HashFile(source_filename, source);
    else
      source_hash = HashFile(source_filename, nullptr);

    if (included_files_.find(source_hash) == included_files_.end()) {
      included_files_[source_hash] = include_filename ? include_filename : "";
      files_included_per_file_[source_filename] = std::set<IncludedFile>();
    } else {
      return NoError();
    }
  }
  if (!include_paths) {
    static const char *current_directory[] = { "", nullptr };
    include_paths = current_directory;
  }
  field_stack_.clear();
  builder_.Clear();
  // Start with a blank namespace just in case this file doesn't have one.
  current_namespace_ = empty_namespace_;

  ECHECK(StartParseFile(source, source_filename));

  // Includes must come before type declarations:
  for (;;) {
    // Parse pre-include proto statements if any:
    if (opts.proto_mode && (attribute_ == "option" || attribute_ == "syntax" ||
                            attribute_ == "package")) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("native_include")) {
      NEXT();
      native_included_files_.emplace_back(attribute_);
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include") || (opts.proto_mode && IsIdent("import"))) {
      NEXT();
      if (opts.proto_mode && attribute_ == "public") NEXT();
      auto name = flatbuffers::PosixPath(attribute_.c_str());
      EXPECT(kTokenStringConstant);
      // Look for the file relative to the directory of the current file.
      std::string filepath;
      if (source_filename) {
        auto source_file_directory =
            flatbuffers::StripFileName(source_filename);
        filepath = flatbuffers::ConCatPathFileName(source_file_directory, name);
      }
      if (filepath.empty() || !FileExists(filepath.c_str())) {
        // Look for the file in include_paths.
        for (auto paths = include_paths; paths && *paths; paths++) {
          filepath = flatbuffers::ConCatPathFileName(*paths, name);
          if (FileExists(filepath.c_str())) break;
        }
      }
      if (filepath.empty())
        return Error("unable to locate include file: " + name);
      if (source_filename) {
        IncludedFile included_file;
        included_file.filename = filepath;
        included_file.schema_name = name;
        files_included_per_file_[source_filename].insert(included_file);
      }

      std::string contents;
      bool file_loaded = LoadFile(filepath.c_str(), true, &contents);
      if (included_files_.find(HashFile(filepath.c_str(), contents.c_str())) ==
          included_files_.end()) {
        // We found an include file that we have not parsed yet.
        // Parse it.
        if (!file_loaded) return Error("unable to load include file: " + name);
        ECHECK(DoParse(contents.c_str(), include_paths, filepath.c_str(),
                       name.c_str()));
        // We generally do not want to output code for any included files:
        if (!opts.generate_all) MarkGenerated();
        // Reset these just in case the included file had them, and the
        // parent doesn't.
        root_struct_def_ = nullptr;
        file_identifier_.clear();
        file_extension_.clear();
        // This is the easiest way to continue this file after an include:
        // instead of saving and restoring all the state, we simply start the
        // file anew. This will cause it to encounter the same include
        // statement again, but this time it will skip it, because it was
        // entered into included_files_.
        // This is recursive, but only go as deep as the number of include
        // statements.
        included_files_.erase(source_hash);
        return DoParse(source, include_paths, source_filename,
                       include_filename);
      }
      EXPECT(';');
    } else {
      break;
    }
  }
  // Now parse all other kinds of declarations:
  while (token_ != kTokenEof) {
    if (opts.proto_mode) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("namespace")) {
      ECHECK(ParseNamespace());
    } else if (token_ == '{') {
      return NoError();
    } else if (IsIdent("enum")) {
      ECHECK(ParseEnum(false, nullptr, source_filename));
    } else if (IsIdent("union")) {
      ECHECK(ParseEnum(true, nullptr, source_filename));
    } else if (IsIdent("root_type")) {
      NEXT();
      auto root_type = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(ParseNamespacing(&root_type, nullptr));
      if (opts.root_type.empty()) {
        if (!SetRootType(root_type.c_str()))
          return Error("unknown root type: " + root_type);
        if (root_struct_def_->fixed) return Error("root type must be a table");
      }
      EXPECT(';');
    } else if (IsIdent("file_identifier")) {
      NEXT();
      file_identifier_ = attribute_;
      EXPECT(kTokenStringConstant);
      if (file_identifier_.length() != flatbuffers::kFileIdentifierLength)
        return Error("file_identifier must be exactly " +
                     NumToString(flatbuffers::kFileIdentifierLength) +
                     " characters");
      EXPECT(';');
    } else if (IsIdent("file_extension")) {
      NEXT();
      file_extension_ = attribute_;
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include")) {
      return Error("includes must come before declarations");
    } else if (IsIdent("attribute")) {
      NEXT();
      auto name = attribute_;
      if (Is(kTokenIdentifier)) {
        NEXT();
      } else {
        EXPECT(kTokenStringConstant);
      }
      EXPECT(';');
      known_attributes_[name] = false;
    } else if (IsIdent("rpc_service")) {
      ECHECK(ParseService(source_filename));
    } else {
      ECHECK(ParseDecl(source_filename));
    }
  }
  EXPECT(kTokenEof);
  if (opts.warnings_as_errors && has_warning_) {
    return Error("treating warnings as errors, failed due to above warnings");
  }
  return NoError();
}